

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_file_get_view_
               (MPIABI_Fint *fh,MPIABI_Fint *disp,MPIABI_Fint *etype,MPIABI_Fint *filetype,
               char *datarep,MPIABI_Fint *ierror,size_t datarep_len)

{
  mpi_file_get_view_();
  return;
}

Assistant:

void mpiabi_file_get_view_(
  const MPIABI_Fint * fh,
  MPIABI_Fint * disp,
  MPIABI_Fint * etype,
  MPIABI_Fint * filetype,
  char * datarep,
  MPIABI_Fint * ierror,
  size_t datarep_len
) {
  return mpi_file_get_view_(
    fh,
    disp,
    etype,
    filetype,
    datarep,
    ierror,
    datarep_len
  );
}